

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# so3.hpp
# Opt level: O0

Transformation *
Sophus::SO3Base<Sophus::SO3<float,_0>_>::hat(Transformation *__return_storage_ptr__,Tangent *omega)

{
  CoeffReturnType pfVar1;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar2;
  Scalar local_5c;
  float local_58;
  float local_54;
  Scalar local_50 [4];
  float local_40;
  Scalar local_3c;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_38;
  DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0> *local_18;
  Tangent *omega_local;
  Transformation *Omega;
  
  local_18 = (DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0> *)omega;
  omega_local = (Tangent *)__return_storage_ptr__;
  Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix(__return_storage_ptr__);
  local_3c = 0.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator<<
            (&local_38,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)__return_storage_ptr__,
             &local_3c);
  pfVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>::operator()(local_18,2);
  local_40 = -*pfVar1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (&local_38,&local_40);
  pfVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>::operator()(local_18,1);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar2,pfVar1);
  pfVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>::operator()(local_18,2);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar2,pfVar1);
  local_50[0] = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar2,local_50)
  ;
  pfVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>::operator()(local_18,0);
  local_54 = -*pfVar1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_54);
  pfVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>::operator()(local_18,1);
  local_58 = -*pfVar1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_58);
  pfVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>::operator()(local_18,0);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar2,pfVar1);
  local_5c = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar2,&local_5c);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_38);
  return __return_storage_ptr__;
}

Assistant:

hat(Tangent const& omega) {
    Transformation Omega;
    // clang-format off
    Omega <<
        Scalar(0), -omega(2),  omega(1),
         omega(2), Scalar(0), -omega(0),
        -omega(1),  omega(0), Scalar(0);
    // clang-format on
    return Omega;
  }